

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O0

void pztopology::TPZLine::GetSideHDivDirections
               (TPZVec<int> *sides,TPZVec<int> *dir,TPZVec<int> *bilounao)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  TPZVec<int> *in_RDX;
  TPZVec<int> *in_RSI;
  TPZVec<int> *in_RDI;
  int is;
  int nsides;
  int local_20;
  
  iVar2 = NumSides();
  (*in_RDI->_vptr_TPZVec[3])(in_RDI,(long)iVar2);
  (*in_RSI->_vptr_TPZVec[3])(in_RSI,(long)iVar2);
  (*in_RDX->_vptr_TPZVec[3])(in_RDX,(long)iVar2);
  for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
    iVar1 = *(int *)(vectorsideorder + (long)local_20 * 4);
    piVar3 = TPZVec<int>::operator[](in_RDI,(long)local_20);
    *piVar3 = iVar1;
    iVar1 = *(int *)(direcaoksioueta + (long)local_20 * 4);
    piVar3 = TPZVec<int>::operator[](in_RSI,(long)local_20);
    *piVar3 = iVar1;
    iVar1 = *(int *)(bilinearounao + (long)local_20 * 4);
    piVar3 = TPZVec<int>::operator[](in_RDX,(long)local_20);
    *piVar3 = iVar1;
  }
  return;
}

Assistant:

void TPZLine::GetSideHDivDirections(TPZVec<int> &sides, TPZVec<int> &dir, TPZVec<int> &bilounao)
    {
        int nsides = NumSides();
        
        sides.Resize(nsides);
        dir.Resize(nsides);
        bilounao.Resize(nsides);
        
        
        for (int is = 0; is<nsides; is++)
        {
            sides[is] = vectorsideorder[is];
            dir[is] = direcaoksioueta[is];
            bilounao[is] = bilinearounao[is];
        }
    }